

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddFile
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          FileDescriptorProto *file,FileDescriptorProto *value)

{
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_01;
  int iVar1;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar5;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *pVVar6;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar7;
  LogMessage *this_02;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>_>
  *pVVar8;
  int i;
  int iVar9;
  int i_2;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  FileDescriptorProto *value_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string path;
  
  value_local = value;
  absl::lts_20250127::container_internal::
  btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,256,false>>>
  ::emplace<std::__cxx11::string_const&,google::protobuf::FileDescriptorProto_const*&>
            ((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_*>,_bool>
              *)&path,this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc),
             &value_local);
  if (path.field_2._M_local_buf[0] == '\0') {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              ((LogMessage *)&path,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x7b);
    this_02 = absl::lts_20250127::log_internal::LogMessage::operator<<
                        ((LogMessage *)&path,(char (*) [34])"File already exists in database: ");
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (this_02,(string *)
                       ((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
    absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&path);
    return false;
  }
  if ((undefined1  [232])((undefined1  [232])file->field_0 & (undefined1  [232])0x2) ==
      (undefined1  [232])0x0) {
    path._M_dataplus._M_p = (pointer)&path.field_2;
    path._M_string_length = 0;
    path.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string
              ((string *)&path,
               (string *)
               ((ulong)(file->field_0)._impl_.package_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
    if (path._M_string_length != 0) {
      std::__cxx11::string::push_back((char)&path);
    }
  }
  this_00 = &(file->field_0)._impl_.message_type_;
  iVar9 = 0;
  do {
    if (*(int *)((long)&file->field_0 + 0x28) <= iVar9) {
      iVar9 = 0;
      goto LAB_0021ca74;
    }
    pVVar5 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                       (&this_00->super_RepeatedPtrFieldBase,iVar9);
    std::operator+(&local_70,&path,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(pVVar5->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
    name._M_str = local_70._M_dataplus._M_p;
    name._M_len = local_70._M_string_length;
    bVar3 = AddSymbol(this,name,value_local);
    std::__cxx11::string::~string((string *)&local_70);
    if (!bVar3) break;
    pvVar2 = (file->field_0)._impl_.name_.tagged_ptr_.ptr_;
    pVVar5 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                       (&this_00->super_RepeatedPtrFieldBase,iVar9);
    bVar3 = AddNestedExtensions(this,(StringViewArg)((ulong)pvVar2 & 0xfffffffffffffffc),pVVar5,
                                value_local);
    iVar9 = iVar9 + 1;
  } while (bVar3);
  goto LAB_0021cb4e;
  while( true ) {
    pVVar6 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                       (&(file->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,iVar9);
    std::operator+(&local_70,&path,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(pVVar6->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
    name_00._M_str = local_70._M_dataplus._M_p;
    name_00._M_len = local_70._M_string_length;
    bVar3 = AddSymbol(this,name_00,value_local);
    std::__cxx11::string::~string((string *)&local_70);
    iVar9 = iVar9 + 1;
    if (!bVar3) break;
LAB_0021ca74:
    if (*(int *)((long)&file->field_0 + 0x40) <= iVar9) {
      this_01 = &(file->field_0)._impl_.extension_;
      iVar9 = 0;
      goto LAB_0021cad0;
    }
  }
  goto LAB_0021cb4e;
  while( true ) {
    pVVar8 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                       (&(file->field_0)._impl_.service_.super_RepeatedPtrFieldBase,iVar9);
    std::operator+(&local_70,&path,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(pVVar8->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
    name_02._M_str = local_70._M_dataplus._M_p;
    name_02._M_len = local_70._M_string_length;
    bVar4 = AddSymbol(this,name_02,value_local);
    std::__cxx11::string::~string((string *)&local_70);
    iVar9 = iVar9 + 1;
    if (!bVar4) break;
LAB_0021cbb9:
    iVar1 = *(int *)((long)&file->field_0 + 0x58);
    bVar3 = iVar1 <= iVar9;
    if (iVar1 <= iVar9) break;
  }
  goto LAB_0021cb50;
  while( true ) {
    pvVar2 = (file->field_0)._impl_.name_.tagged_ptr_.ptr_;
    pVVar7 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                       (&this_01->super_RepeatedPtrFieldBase,iVar9);
    bVar3 = AddExtension(this,(StringViewArg)((ulong)pvVar2 & 0xfffffffffffffffc),pVVar7,value_local
                        );
    iVar9 = iVar9 + 1;
    if (!bVar3) break;
LAB_0021cad0:
    if (*(int *)((long)&file->field_0 + 0x70) <= iVar9) {
      iVar9 = 0;
      goto LAB_0021cbb9;
    }
    pVVar7 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                       (&this_01->super_RepeatedPtrFieldBase,iVar9);
    std::operator+(&local_70,&path,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(pVVar7->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
    name_01._M_str = local_70._M_dataplus._M_p;
    name_01._M_len = local_70._M_string_length;
    bVar3 = AddSymbol(this,name_01,value_local);
    std::__cxx11::string::~string((string *)&local_70);
    if (!bVar3) break;
  }
LAB_0021cb4e:
  bVar3 = false;
LAB_0021cb50:
  std::__cxx11::string::~string((string *)&path);
  return bVar3;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddFile(
    const FileDescriptorProto& file, Value value) {
  if (!by_name_.emplace(file.name(), value).second) {
    ABSL_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  // We must be careful here -- calling file.package() if file.has_package() is
  // false could access an uninitialized static-storage variable if we are being
  // run at startup time.
  std::string path = file.has_package() ? file.package() : std::string();
  if (!path.empty()) path += '.';

  for (int i = 0; i < file.message_type_size(); i++) {
    if (!AddSymbol(path + file.message_type(i).name(), value)) return false;
    if (!AddNestedExtensions(file.name(), file.message_type(i), value))
      return false;
  }
  for (int i = 0; i < file.enum_type_size(); i++) {
    if (!AddSymbol(path + file.enum_type(i).name(), value)) return false;
  }
  for (int i = 0; i < file.extension_size(); i++) {
    if (!AddSymbol(path + file.extension(i).name(), value)) return false;
    if (!AddExtension(file.name(), file.extension(i), value)) return false;
  }
  for (int i = 0; i < file.service_size(); i++) {
    if (!AddSymbol(path + file.service(i).name(), value)) return false;
  }

  return true;
}